

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OscReceivedElements.cpp
# Opt level: O0

float __thiscall osc::ReceivedMessageArgument::AsFloatUnchecked(ReceivedMessageArgument *this)

{
  undefined4 local_14;
  anon_union_4_2_94730044 u;
  ReceivedMessageArgument *this_local;
  
  local_14 = (float)CONCAT13(*this->argumentPtr_,
                             CONCAT12(this->argumentPtr_[1],
                                      CONCAT11(this->argumentPtr_[2],this->argumentPtr_[3])));
  return local_14;
}

Assistant:

float ReceivedMessageArgument::AsFloatUnchecked() const
{
#ifdef OSC_HOST_LITTLE_ENDIAN
    union{
        float f;
        char c[4];
    } u;

    u.c[0] = argumentPtr_[3];
    u.c[1] = argumentPtr_[2];
    u.c[2] = argumentPtr_[1];
    u.c[3] = argumentPtr_[0];

    return u.f;
#else
	return *(float*)argument_;
#endif
}